

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraBmc.c
# Opt level: O0

Aig_Man_t * Fra_BmcFrames(Fra_Bmc_t *p,int fKeepPos)

{
  int iVar1;
  int iVar2;
  Aig_Man_t *p_00;
  char *pcVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  void *__ptr;
  Aig_Obj_t *p1;
  int local_44;
  int local_40;
  int f;
  int k;
  int i;
  Aig_Obj_t **pLatches;
  Aig_Obj_t *pObjNew;
  Aig_Obj_t *pObj;
  Aig_Man_t *pAigFrames;
  int fKeepPos_local;
  Fra_Bmc_t *p_local;
  
  iVar1 = Aig_ManObjNumMax(p->pAig);
  p_00 = Aig_ManStart(iVar1 * p->nFramesAll);
  pcVar3 = Abc_UtilStrsav(p->pAig->pName);
  p_00->pName = pcVar3;
  pcVar3 = Abc_UtilStrsav(p->pAig->pSpec);
  p_00->pSpec = pcVar3;
  for (local_44 = 0; local_44 < p->nFramesAll; local_44 = local_44 + 1) {
    pAVar4 = Aig_ManConst1(p->pAig);
    pAVar5 = Aig_ManConst1(p_00);
    Bmc_ObjSetFrames(pAVar4,local_44,pAVar5);
  }
  for (local_44 = 0; local_44 < p->nFramesAll; local_44 = local_44 + 1) {
    f = 0;
    while( true ) {
      iVar1 = Aig_ManCiNum(p->pAig);
      iVar2 = Aig_ManRegNum(p->pAig);
      if (iVar1 - iVar2 <= f) break;
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vCis,f);
      pAVar5 = Aig_ObjCreateCi(p_00);
      Bmc_ObjSetFrames(pAVar4,local_44,pAVar5);
      f = f + 1;
    }
  }
  iVar1 = Aig_ManCiNum(p->pAig);
  iVar2 = Aig_ManRegNum(p->pAig);
  for (f = iVar1 - iVar2; iVar1 = Vec_PtrSize(p->pAig->vCis), f < iVar1; f = f + 1) {
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vCis,f);
    pAVar5 = Aig_ManConst0(p_00);
    Bmc_ObjSetFrames(pAVar4,0,pAVar5);
  }
  iVar1 = Aig_ManRegNum(p->pAig);
  __ptr = malloc((long)iVar1 << 3);
  for (local_44 = 0; local_44 < p->nFramesAll; local_44 = local_44 + 1) {
    for (f = 0; iVar1 = Vec_PtrSize(p->pAig->vObjs), f < iVar1; f = f + 1) {
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vObjs,f);
      if ((pAVar4 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pAVar4), iVar1 != 0)) {
        pAVar5 = Bmc_ObjChild0Frames(pAVar4,local_44);
        p1 = Bmc_ObjChild1Frames(pAVar4,local_44);
        pAVar5 = Aig_And(p_00,pAVar5,p1);
        Bmc_ObjSetFrames(pAVar4,local_44,pAVar5);
      }
    }
    if (local_44 == p->nFramesAll + -1) break;
    local_40 = 0;
    iVar1 = Aig_ManCoNum(p->pAig);
    iVar2 = Aig_ManRegNum(p->pAig);
    for (f = iVar1 - iVar2; iVar1 = Vec_PtrSize(p->pAig->vCos), f < iVar1; f = f + 1) {
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vCos,f);
      pAVar4 = Bmc_ObjChild0Frames(pAVar4,local_44);
      *(Aig_Obj_t **)((long)__ptr + (long)local_40 * 8) = pAVar4;
      local_40 = local_40 + 1;
    }
    iVar1 = Aig_ManRegNum(p->pAig);
    if (local_40 != iVar1) {
      __assert_fail("k == Aig_ManRegNum(p->pAig)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fra/fraBmc.c"
                    ,0x112,"Aig_Man_t *Fra_BmcFrames(Fra_Bmc_t *, int)");
    }
    local_40 = 0;
    iVar1 = Aig_ManCiNum(p->pAig);
    iVar2 = Aig_ManRegNum(p->pAig);
    for (f = iVar1 - iVar2; iVar1 = Vec_PtrSize(p->pAig->vCis), f < iVar1; f = f + 1) {
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vCis,f);
      Bmc_ObjSetFrames(pAVar4,local_44 + 1,*(Aig_Obj_t **)((long)__ptr + (long)local_40 * 8));
      local_40 = local_40 + 1;
    }
    iVar1 = Aig_ManRegNum(p->pAig);
    if (local_40 != iVar1) {
      __assert_fail("k == Aig_ManRegNum(p->pAig)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fra/fraBmc.c"
                    ,0x117,"Aig_Man_t *Fra_BmcFrames(Fra_Bmc_t *, int)");
    }
  }
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  if (fKeepPos == 0) {
    for (f = 0; iVar1 = Vec_PtrSize(p_00->vObjs), f < iVar1; f = f + 1) {
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p_00->vObjs,f);
      if (((pAVar4 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pAVar4), iVar1 != 0)) &&
         ((*(ulong *)&pAVar4->field_0x18 >> 6 & 0x3ffffff) == 0)) {
        Aig_ObjCreateCo(p_00,pAVar4);
      }
    }
  }
  else {
    for (local_44 = 0; local_44 < p->nFramesAll; local_44 = local_44 + 1) {
      f = 0;
      while( true ) {
        iVar1 = Aig_ManCoNum(p->pAig);
        iVar2 = Aig_ManRegNum(p->pAig);
        if (iVar1 - iVar2 <= f) break;
        pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vCos,f);
        pAVar4 = Bmc_ObjChild0Frames(pAVar4,local_44);
        Aig_ObjCreateCo(p_00,pAVar4);
        f = f + 1;
      }
    }
    Aig_ManCleanup(p_00);
  }
  return p_00;
}

Assistant:

Aig_Man_t * Fra_BmcFrames( Fra_Bmc_t * p, int fKeepPos )
{
    Aig_Man_t * pAigFrames;
    Aig_Obj_t * pObj, * pObjNew;
    Aig_Obj_t ** pLatches;
    int i, k, f;

    // start the fraig package
    pAigFrames = Aig_ManStart( Aig_ManObjNumMax(p->pAig) * p->nFramesAll );
    pAigFrames->pName = Abc_UtilStrsav( p->pAig->pName );
    pAigFrames->pSpec = Abc_UtilStrsav( p->pAig->pSpec );
    // create PI nodes for the frames
    for ( f = 0; f < p->nFramesAll; f++ )
        Bmc_ObjSetFrames( Aig_ManConst1(p->pAig), f, Aig_ManConst1(pAigFrames) );
    for ( f = 0; f < p->nFramesAll; f++ )
        Aig_ManForEachPiSeq( p->pAig, pObj, i )
            Bmc_ObjSetFrames( pObj, f, Aig_ObjCreateCi(pAigFrames) );
    // set initial state for the latches
    Aig_ManForEachLoSeq( p->pAig, pObj, i )
        Bmc_ObjSetFrames( pObj, 0, Aig_ManConst0(pAigFrames) );

    // add timeframes
    pLatches = ABC_ALLOC( Aig_Obj_t *, Aig_ManRegNum(p->pAig) );
    for ( f = 0; f < p->nFramesAll; f++ )
    {
        // add internal nodes of this frame
        Aig_ManForEachNode( p->pAig, pObj, i )
        {
            pObjNew = Aig_And( pAigFrames, Bmc_ObjChild0Frames(pObj,f), Bmc_ObjChild1Frames(pObj,f) );
            Bmc_ObjSetFrames( pObj, f, pObjNew );
        }
        if ( f == p->nFramesAll - 1 )
            break;
        // save the latch input values
        k = 0;
        Aig_ManForEachLiSeq( p->pAig, pObj, i )
            pLatches[k++] = Bmc_ObjChild0Frames(pObj,f);
        assert( k == Aig_ManRegNum(p->pAig) );
        // insert them to the latch output values
        k = 0;
        Aig_ManForEachLoSeq( p->pAig, pObj, i )
            Bmc_ObjSetFrames( pObj, f+1, pLatches[k++] );
        assert( k == Aig_ManRegNum(p->pAig) );
    }
    ABC_FREE( pLatches );
    if ( fKeepPos )
    {
        for ( f = 0; f < p->nFramesAll; f++ )
            Aig_ManForEachPoSeq( p->pAig, pObj, i )
                Aig_ObjCreateCo( pAigFrames, Bmc_ObjChild0Frames(pObj,f) );
        Aig_ManCleanup( pAigFrames );
    }
    else
    {
        // add POs to all the dangling nodes
        Aig_ManForEachObj( pAigFrames, pObjNew, i )
            if ( Aig_ObjIsNode(pObjNew) && pObjNew->nRefs == 0 )
                Aig_ObjCreateCo( pAigFrames, pObjNew );
    }
    // return the new manager
    return pAigFrames;
}